

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbannouncer.cpp
# Opt level: O2

bool AnnounceTelefrag(AActor *killer,AActor *killee)

{
  bool bVar1;
  int iVar2;
  int gender;
  char *from;
  char *victim;
  char *killer_00;
  bool bVar3;
  char assembled [1024];
  
  iVar2 = FRandom::operator()(&pr_bbannounce);
  if ((cl_bbannounce.Value == true) && (multiplayer == true)) {
    from = FStringTable::operator()(&GStrings,"OB_MPTELEFRAG");
    bVar3 = from != (char *)0x0;
    if (bVar3) {
      gender = userinfo_t::GetGender(&killee->player->userinfo);
      victim = userinfo_t::GetName(&killee->player->userinfo);
      killer_00 = userinfo_t::GetName(&killer->player->userinfo);
      SexMessage(from,assembled,gender,victim,killer_00);
      Printf(1,"%s\n",assembled);
    }
    bVar1 = AActor::CheckLocalView(killee,consoleplayer);
    if ((!bVar1) && (bVar1 = AActor::CheckLocalView(killer,consoleplayer), !bVar1)) {
      return bVar3;
    }
    DoVoiceAnnounce(_ZL14TelefragSounds_rel +
                    *(int *)(_ZL14TelefragSounds_rel + (long)(iVar2 % 7) * 4));
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool AnnounceTelefrag (AActor *killer, AActor *killee)
{
	int rannum = pr_bbannounce();

	if (cl_bbannounce && multiplayer)
	{
		const char *message = GStrings("OB_MPTELEFRAG");
		if (message != NULL)
		{
			char assembled[1024];

			SexMessage (message, assembled, killee->player->userinfo.GetGender(),
				killee->player->userinfo.GetName(), killer->player->userinfo.GetName());
			Printf (PRINT_MEDIUM, "%s\n", assembled);
		}
		if (killee->CheckLocalView (consoleplayer) ||
			killer->CheckLocalView (consoleplayer))
		{
			DoVoiceAnnounce (TelefragSounds[rannum % 7]);
		}
		return message != NULL;
	}
	return false;
}